

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bit_cost.cpp
# Opt level: O0

double duckdb_brotli::BrotliPopulationCostLiteral(HistogramLiteral *histogram)

{
  long lVar1;
  undefined8 uVar2;
  uint uVar3;
  uint uVar4;
  double dVar5;
  uint uVar6;
  long in_RDI;
  bool bVar7;
  double dVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar22 [16];
  size_t k;
  uint32_t reps;
  size_t depth;
  double log2p;
  double log2total;
  uint32_t depth_histo [18];
  size_t max_depth;
  uint32_t __brotli_swap_tmp;
  size_t j;
  uint32_t histomax_1;
  uint32_t h23;
  uint32_t histo [4];
  uint32_t histomax;
  uint32_t histo2;
  uint32_t histo1;
  uint32_t histo0;
  size_t i;
  double bits;
  size_t s [5];
  int count;
  size_t data_size;
  double retval;
  size_t sum;
  size_t p;
  uint32_t *population_end;
  double retval_1;
  size_t sum_1;
  uint local_1e0;
  uint local_1dc;
  uint local_1d8;
  ulong local_1d0;
  uint local_1c4;
  ulong local_1c0;
  uint local_1a8 [17];
  int local_164;
  uint auStack_160 [2];
  ulong local_158;
  uint local_14c;
  ulong local_148;
  uint local_138 [8];
  ulong local_118;
  double local_110;
  ulong local_108 [5];
  int local_dc;
  ulong local_d8;
  long local_d0;
  double local_c8;
  ulong local_a8;
  double local_a0;
  ulong local_98;
  double local_90;
  double local_88;
  ulong local_80 [2];
  uint *local_70;
  ulong local_68;
  uint *local_60;
  double local_58;
  ulong local_50;
  ulong *local_48;
  undefined8 local_40;
  uint *local_38;
  ulong local_30;
  double local_28;
  ulong local_20;
  double local_18;
  ulong local_10;
  double local_8;
  undefined4 uVar20;
  undefined4 uVar21;
  
  local_d8 = 0x100;
  local_dc = 0;
  local_110 = 0.0;
  if (*(long *)(in_RDI + 0x400) == 0) {
    local_c8 = 12.0;
  }
  else {
    local_d0 = in_RDI;
    for (local_118 = 0; local_118 < local_d8; local_118 = local_118 + 1) {
      if (*(int *)(local_d0 + local_118 * 4) != 0) {
        local_108[local_dc] = local_118;
        local_dc = local_dc + 1;
        if (4 < local_dc) break;
      }
    }
    if (local_dc == 1) {
      local_c8 = 12.0;
    }
    else if (local_dc == 2) {
      uVar2 = *(undefined8 *)(local_d0 + 0x400);
      auVar22._8_4_ = (int)((ulong)uVar2 >> 0x20);
      auVar22._0_8_ = uVar2;
      auVar22._12_4_ = 0x45300000;
      local_c8 = (auVar22._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)uVar2) - 4503599627370496.0) + 20.0;
    }
    else if (local_dc == 3) {
      uVar6 = *(uint *)(local_d0 + local_108[0] * 4);
      uVar3 = *(uint *)(local_d0 + local_108[1] * 4);
      uVar4 = *(uint *)(local_d0 + local_108[2] * 4);
      local_1d8 = uVar4;
      if (uVar4 < uVar3) {
        local_1d8 = uVar3;
      }
      local_1dc = uVar6;
      if (uVar6 <= local_1d8) {
        local_1dc = local_1d8;
      }
      local_c8 = ((double)((uVar6 + uVar3 + uVar4) * 2) + 28.0) - (double)local_1dc;
    }
    else if (local_dc == 4) {
      for (local_118 = 0; local_118 < 4; local_118 = local_118 + 1) {
        local_138[local_118] = *(uint *)(local_d0 + local_108[local_118] * 4);
      }
      for (local_118 = 0; local_118 < 4; local_118 = local_118 + 1) {
        for (local_148 = local_118 + 1; local_148 < 4; local_148 = local_148 + 1) {
          if (local_138[local_118] < local_138[local_148]) {
            local_14c = local_138[local_148];
            local_138[local_148] = local_138[local_118];
            local_138[local_118] = local_14c;
          }
        }
      }
      uVar6 = local_138[2] + local_138[3];
      local_1e0 = uVar6;
      if (uVar6 <= local_138[0]) {
        local_1e0 = local_138[0];
      }
      local_c8 = ((double)(uVar6 * 3) + 37.0 + (double)((local_138[0] + local_138[1]) * 2)) -
                 (double)local_1e0;
    }
    else {
      local_158 = 1;
      memset(local_1a8,0,0x48);
      local_98 = *(ulong *)(local_d0 + 0x400);
      if (local_98 < 0x100) {
        local_90 = *(double *)(kBrotliLog2Table + local_98 * 8);
      }
      else {
        auVar9._8_4_ = (int)(local_98 >> 0x20);
        auVar9._0_8_ = local_98;
        auVar9._12_4_ = 0x45300000;
        local_90 = log2((auVar9._8_8_ - 1.9342813113834067e+25) +
                        ((double)CONCAT44(0x43300000,(int)local_98) - 4503599627370496.0));
      }
      dVar5 = local_90;
      local_118 = 0;
      while (local_118 < local_d8) {
        if (*(int *)(local_d0 + local_118 * 4) == 0) {
          local_1c4 = 1;
          local_1d0 = local_118;
          while( true ) {
            local_1d0 = local_1d0 + 1;
            bVar7 = false;
            if (local_1d0 < local_d8) {
              bVar7 = *(int *)(local_d0 + local_1d0 * 4) == 0;
            }
            if (!bVar7) break;
            local_1c4 = local_1c4 + 1;
          }
          local_118 = local_1c4 + local_118;
          if (local_118 == local_d8) break;
          if (local_1c4 < 3) {
            local_1a8[0] = local_1c4 + local_1a8[0];
          }
          else {
            for (local_1c4 = local_1c4 - 2; local_1c4 != 0; local_1c4 = local_1c4 >> 3) {
              local_164 = local_164 + 1;
              local_110 = local_110 + 3.0;
            }
          }
        }
        else {
          uVar6 = *(uint *)(local_d0 + local_118 * 4);
          local_a8 = CONCAT44(0,uVar6);
          if (local_a8 < 0x100) {
            local_a0 = *(double *)(kBrotliLog2Table + local_a8 * 8);
          }
          else {
            auVar10._8_4_ = 0;
            auVar10._0_8_ = local_a8;
            auVar10._12_4_ = 0x45300000;
            local_a0 = log2((auVar10._8_8_ - 1.9342813113834067e+25) +
                            ((double)CONCAT44(0x43300000,uVar6) - 4503599627370496.0));
          }
          dVar8 = (dVar5 - local_a0) + 0.5;
          local_1c0 = (ulong)dVar8;
          local_1c0 = local_1c0 | (long)(dVar8 - 9.223372036854776e+18) & (long)local_1c0 >> 0x3f;
          local_110 = (double)*(uint *)(local_d0 + local_118 * 4) * (dVar5 - local_a0) + local_110;
          if (0xf < local_1c0) {
            local_1c0 = 0xf;
          }
          if (local_158 < local_1c0) {
            local_158 = local_1c0;
          }
          local_1a8[local_1c0] = local_1a8[local_1c0] + 1;
          local_118 = local_118 + 1;
        }
      }
      lVar1 = local_158 * 2 + 0x12;
      auVar11._8_4_ = (int)((ulong)lVar1 >> 0x20);
      auVar11._0_8_ = lVar1;
      auVar11._12_4_ = 0x45300000;
      local_110 = (auVar11._8_8_ - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,(int)lVar1) - 4503599627370496.0) + local_110;
      local_70 = local_1a8;
      local_80[1] = 0x12;
      local_40 = 0x12;
      local_48 = local_80;
      local_50 = 0;
      local_58 = 0.0;
      local_60 = auStack_160;
      local_38 = local_70;
      while (local_38 < local_60) {
        uVar6 = *local_38;
        local_68 = CONCAT44(0,uVar6);
        local_50 = local_50 + local_68;
        auVar12._8_4_ = 0;
        auVar12._0_8_ = local_68;
        auVar12._12_4_ = 0x45300000;
        local_10 = local_68;
        if (local_68 < 0x100) {
          local_8 = *(double *)(kBrotliLog2Table + local_68 * 8);
          local_38 = local_38 + 1;
        }
        else {
          auVar13._8_4_ = 0;
          auVar13._0_8_ = local_68;
          auVar13._12_4_ = 0x45300000;
          local_38 = local_38 + 1;
          local_8 = log2((auVar13._8_8_ - 1.9342813113834067e+25) +
                         ((double)CONCAT44(0x43300000,uVar6) - 4503599627370496.0));
        }
        local_58 = -((auVar12._8_8_ - 1.9342813113834067e+25) +
                    ((double)CONCAT44(0x43300000,uVar6) - 4503599627370496.0)) * local_8 + local_58;
        uVar6 = *local_38;
        local_68 = CONCAT44(0,uVar6);
        local_50 = local_50 + local_68;
        auVar14._8_4_ = 0;
        auVar14._0_8_ = local_68;
        auVar14._12_4_ = 0x45300000;
        local_20 = local_68;
        if (local_68 < 0x100) {
          local_18 = *(double *)(kBrotliLog2Table + local_68 * 8);
          local_38 = local_38 + 1;
        }
        else {
          auVar15._8_4_ = 0;
          auVar15._0_8_ = local_68;
          auVar15._12_4_ = 0x45300000;
          local_38 = local_38 + 1;
          local_18 = log2((auVar15._8_8_ - 1.9342813113834067e+25) +
                          ((double)CONCAT44(0x43300000,uVar6) - 4503599627370496.0));
        }
        local_58 = -((auVar14._8_8_ - 1.9342813113834067e+25) +
                    ((double)CONCAT44(0x43300000,uVar6) - 4503599627370496.0)) * local_18 + local_58
        ;
      }
      if (local_50 != 0) {
        uVar20 = (undefined4)(local_50 >> 0x20);
        auVar16._8_4_ = uVar20;
        auVar16._0_8_ = local_50;
        auVar16._12_4_ = 0x45300000;
        uVar21 = (undefined4)local_50;
        local_30 = local_50;
        if (local_50 < 0x100) {
          local_28 = *(double *)(kBrotliLog2Table + local_50 * 8);
        }
        else {
          auVar17._8_4_ = uVar20;
          auVar17._0_8_ = local_50;
          auVar17._12_4_ = 0x45300000;
          local_28 = log2((auVar17._8_8_ - 1.9342813113834067e+25) +
                          ((double)CONCAT44(0x43300000,uVar21) - 4503599627370496.0));
        }
        local_58 = ((auVar16._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,uVar21) - 4503599627370496.0)) * local_28 + local_58
        ;
      }
      *local_48 = local_50;
      local_88 = local_58;
      uVar21 = (undefined4)(local_80[0] >> 0x20);
      auVar18._8_4_ = uVar21;
      auVar18._0_8_ = local_80[0];
      auVar18._12_4_ = 0x45300000;
      if (local_58 <
          (auVar18._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)local_80[0]) - 4503599627370496.0)) {
        auVar19._8_4_ = uVar21;
        auVar19._0_8_ = local_80[0];
        auVar19._12_4_ = 0x45300000;
        local_88 = (auVar19._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)local_80[0]) - 4503599627370496.0);
      }
      local_c8 = local_88 + local_110;
    }
  }
  return local_c8;
}

Assistant:

double FN(BrotliPopulationCost)(const HistogramType* histogram) {
  static const double kOneSymbolHistogramCost = 12;
  static const double kTwoSymbolHistogramCost = 20;
  static const double kThreeSymbolHistogramCost = 28;
  static const double kFourSymbolHistogramCost = 37;
  const size_t data_size = FN(HistogramDataSize)();
  int count = 0;
  size_t s[5];
  double bits = 0.0;
  size_t i;
  if (histogram->total_count_ == 0) {
    return kOneSymbolHistogramCost;
  }
  for (i = 0; i < data_size; ++i) {
    if (histogram->data_[i] > 0) {
      s[count] = i;
      ++count;
      if (count > 4) break;
    }
  }
  if (count == 1) {
    return kOneSymbolHistogramCost;
  }
  if (count == 2) {
    return (kTwoSymbolHistogramCost + (double)histogram->total_count_);
  }
  if (count == 3) {
    const uint32_t histo0 = histogram->data_[s[0]];
    const uint32_t histo1 = histogram->data_[s[1]];
    const uint32_t histo2 = histogram->data_[s[2]];
    const uint32_t histomax =
        BROTLI_MAX(uint32_t, histo0, BROTLI_MAX(uint32_t, histo1, histo2));
    return (kThreeSymbolHistogramCost +
            2 * (histo0 + histo1 + histo2) - histomax);
  }
  if (count == 4) {
    uint32_t histo[4];
    uint32_t h23;
    uint32_t histomax;
    for (i = 0; i < 4; ++i) {
      histo[i] = histogram->data_[s[i]];
    }
    /* Sort */
    for (i = 0; i < 4; ++i) {
      size_t j;
      for (j = i + 1; j < 4; ++j) {
        if (histo[j] > histo[i]) {
          BROTLI_SWAP(uint32_t, histo, j, i);
        }
      }
    }
    h23 = histo[2] + histo[3];
    histomax = BROTLI_MAX(uint32_t, h23, histo[0]);
    return (kFourSymbolHistogramCost +
            3 * h23 + 2 * (histo[0] + histo[1]) - histomax);
  }

  {
    /* In this loop we compute the entropy of the histogram and simultaneously
       build a simplified histogram of the code length codes where we use the
       zero repeat code 17, but we don't use the non-zero repeat code 16. */
    size_t max_depth = 1;
    uint32_t depth_histo[BROTLI_CODE_LENGTH_CODES] = { 0 };
    const double log2total = FastLog2(histogram->total_count_);
    for (i = 0; i < data_size;) {
      if (histogram->data_[i] > 0) {
        /* Compute -log2(P(symbol)) = -log2(count(symbol)/total_count) =
                                    = log2(total_count) - log2(count(symbol)) */
        double log2p = log2total - FastLog2(histogram->data_[i]);
        /* Approximate the bit depth by round(-log2(P(symbol))) */
        size_t depth = (size_t)(log2p + 0.5);
        bits += histogram->data_[i] * log2p;
        if (depth > 15) {
          depth = 15;
        }
        if (depth > max_depth) {
          max_depth = depth;
        }
        ++depth_histo[depth];
        ++i;
      } else {
        /* Compute the run length of zeros and add the appropriate number of 0
           and 17 code length codes to the code length code histogram. */
        uint32_t reps = 1;
        size_t k;
        for (k = i + 1; k < data_size && histogram->data_[k] == 0; ++k) {
          ++reps;
        }
        i += reps;
        if (i == data_size) {
          /* Don't add any cost for the last zero run, since these are encoded
             only implicitly. */
          break;
        }
        if (reps < 3) {
          depth_histo[0] += reps;
        } else {
          reps -= 2;
          while (reps > 0) {
            ++depth_histo[BROTLI_REPEAT_ZERO_CODE_LENGTH];
            /* Add the 3 extra bits for the 17 code length code. */
            bits += 3;
            reps >>= 3;
          }
        }
      }
    }
    /* Add the estimated encoding cost of the code length code histogram. */
    bits += (double)(18 + 2 * max_depth);
    /* Add the entropy of the code length code histogram. */
    bits += BitsEntropy(depth_histo, BROTLI_CODE_LENGTH_CODES);
  }
  return bits;
}